

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O1

bool __thiscall BmsChannel::IsBmpChannel(BmsChannel *this)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = BmsWord::ToInteger(&this->channel_number_);
  bVar1 = true;
  if (((10 < uVar2) || ((0x4d0U >> (uVar2 & 0x1f) & 1) == 0)) && (uVar2 != 0x16d)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
BmsChannel::IsBmpChannel(void) const
{
	switch (channel_number_.ToInteger()) {
		// 04 06 07 0A A5
	case 4:
	case 6:
	case 7:
	case 10:
	case 365:
		return true;

	default:
		return false;
	}
}